

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O3

void EV_LightTurnOnPartway(int tag,double frac)

{
  sector_t_conflict *psVar1;
  line_t_conflict *plVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  sector_t_conflict *psVar8;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar9;
  double dVar10;
  FSectorTagIterator it;
  FSectorTagIterator local_30;
  undefined1 local_28 [16];
  double local_18;
  
  local_28._8_4_ = in_XMM0_Dc;
  local_28._0_8_ = frac;
  local_28._12_4_ = in_XMM0_Dd;
  if (tag == 0) {
    local_30.start = 0;
  }
  else {
    local_30.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  local_30.searchtag = tag;
  uVar3 = FSectorTagIterator::Next(&local_30);
  if (-1 < (int)uVar3) {
    dVar9 = 1.0;
    if ((double)local_28._0_8_ <= 1.0) {
      dVar9 = (double)local_28._0_8_;
    }
    local_28._0_8_ = -(ulong)(0.0 < (double)local_28._0_8_) & (ulong)dVar9;
    local_28._8_8_ = 0;
    local_18 = 1.0 - (double)local_28._0_8_;
    do {
      psVar1 = sectors + uVar3;
      iVar4 = (int)sectors[uVar3].lightlevel;
      if ((long)sectors[uVar3].linecount < 1) {
        dVar9 = 0.0;
      }
      else {
        lVar5 = 0;
        iVar6 = 0;
        do {
          plVar2 = psVar1->lines[lVar5];
          if (((plVar2->flags & 4) != 0) &&
             (((psVar8 = plVar2->frontsector, psVar8 != psVar1 ||
               (psVar8 = plVar2->backsector, psVar8 != psVar1)) &&
              (psVar8 != (sector_t_conflict *)0x0)))) {
            iVar7 = (int)psVar8->lightlevel;
            if (iVar6 <= iVar7) {
              iVar6 = iVar7;
            }
            if (iVar7 <= iVar4) {
              iVar4 = iVar7;
            }
          }
          lVar5 = lVar5 + 1;
        } while (sectors[uVar3].linecount != lVar5);
        dVar9 = (double)iVar6;
      }
      dVar10 = (double)iVar4 * local_18 + dVar9 * (double)local_28._0_8_;
      dVar9 = -32768.0;
      if (-32768.0 <= dVar10) {
        dVar9 = dVar10;
      }
      dVar10 = 32767.0;
      if (dVar9 <= 32767.0) {
        dVar10 = dVar9;
      }
      psVar1->lightlevel = (short)(int)dVar10;
      uVar3 = FSectorTagIterator::Next(&local_30);
    } while (-1 < (int)uVar3);
  }
  return;
}

Assistant:

void EV_LightTurnOnPartway (int tag, double frac)
{
	frac = clamp(frac, 0., 1.);

	// Search all sectors for ones with same tag as activating line
	int secnum;
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sector_t *temp, *sector = &sectors[secnum];
		int j, bright = 0, min = sector->lightlevel;

		for (j = 0; j < sector->linecount; ++j)
		{
			if ((temp = getNextSector (sector->lines[j], sector)) != NULL)
			{
				if (temp->lightlevel > bright)
				{
					bright = temp->lightlevel;
				}
				if (temp->lightlevel < min)
				{
					min = temp->lightlevel;
				}
			}
		}
		sector->SetLightLevel(int(frac * bright + (1 - frac) * min));
	}
}